

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeCacheOp(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  int32_t iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint Reg;
  uint in_ESI;
  MCInst *in_RDI;
  uint Base;
  uint Hint;
  int Offset;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar1 = SignExtend32(in_ESI & 0xffff,0x10);
  uVar2 = fieldFromInstruction(in_ESI,0x10,5);
  uVar3 = fieldFromInstruction(in_ESI,0x15,5);
  Reg = getReg((MCRegisterInfo *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc
               ,in_stack_ffffffffffffffc8);
  MCOperand_CreateReg0(in_RDI,Reg);
  MCOperand_CreateImm0(in_RDI,(long)iVar1);
  MCOperand_CreateImm0(in_RDI,(ulong)uVar2);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeCacheOp(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(Insn & 0xffff, 16);
	unsigned Hint = fieldFromInstruction(Insn, 16, 5);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);

	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);
	MCOperand_CreateImm0(Inst, Hint);

	return MCDisassembler_Success;
}